

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O3

bool __thiscall SQClass::GetConstructor(SQClass *this,SQObjectPtr *ctor)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  long lVar4;
  SQClassMember *pSVar5;
  SQTable *pSVar6;
  SQTable *pSVar7;
  
  lVar4 = this->_constructoridx;
  if (lVar4 != -1) {
    pSVar5 = (this->_methods)._vals;
    SVar2 = (ctor->super_SQObject)._type;
    pSVar6 = (ctor->super_SQObject)._unVal.pTable;
    pSVar7 = pSVar5[lVar4].val.super_SQObject._unVal.pTable;
    (ctor->super_SQObject)._unVal.pTable = pSVar7;
    SVar3 = pSVar5[lVar4].val.super_SQObject._type;
    (ctor->super_SQObject)._type = SVar3;
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  return lVar4 != -1;
}

Assistant:

bool GetConstructor(SQObjectPtr &ctor)
    {
        if(_constructoridx != -1) {
            ctor = _methods[_constructoridx].val;
            return true;
        }
        return false;
    }